

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *this,TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
  super_TPZTetrahedron.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_01892eb0;
  iVar1 = (cp->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes
          [1];
  iVar2 = (cp->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes
          [2];
  iVar3 = (cp->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes
          [3];
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0] =
       (cp->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0];
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[1] =
       iVar1;
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[2] =
       iVar2;
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[3] =
       iVar3;
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
  super_TPZTetrahedron.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ebe8;
  lVar4 = 0x40;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar4 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar4 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar4 + -0x10) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x160);
  this_00 = (TPZTransform<double> *)&this->field_0x150;
  lVar4 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar4));
    lVar4 = lVar4 + 0x1a0;
  } while (lVar4 != 0x1380);
  t = (TPZTransform<double> *)&cp->field_0x150;
  lVar4 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar4) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar4);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar4) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar4);
    TPZTransform<double>::operator=(this_00,t);
    lVar4 = lVar4 + 0x18;
    t = t + 1;
    this_00 = this_00 + 1;
  } while (lVar4 != 0x120);
  this->fGeoEl = (TPZGeoEl *)0x0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x3f);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }